

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAppendList.cpp
# Opt level: O0

void de::AppendList_selfTest(void)

{
  deUint32 dVar1;
  
  anon_unknown_1::runAppendListTest(1,1000,500);
  anon_unknown_1::runAppendListTest(1,1000,2000);
  anon_unknown_1::runAppendListTest(1,0x23,1);
  anon_unknown_1::runAppendListTest(2,10000,500);
  anon_unknown_1::runAppendListTest(2,100,10);
  dVar1 = deGetNumAvailableLogicalCores();
  if (3 < dVar1) {
    anon_unknown_1::runAppendListTest(4,10000,500);
    anon_unknown_1::runAppendListTest(4,100,10);
  }
  anon_unknown_1::runClearTest(1,1,1);
  anon_unknown_1::runClearTest(1,2,10);
  anon_unknown_1::runClearTest(0x32,0x19,10);
  anon_unknown_1::runClearTest(9,0x32,10);
  anon_unknown_1::runClearTest(10,0x32,10);
  anon_unknown_1::runClearTest(0x32,9,10);
  anon_unknown_1::runClearTest(0x32,10,10);
  return;
}

Assistant:

void AppendList_selfTest (void)
{
	// Single-threaded
	runAppendListTest(1, 1000, 500);
	runAppendListTest(1, 1000, 2000);
	runAppendListTest(1, 35, 1);

	// Multi-threaded
	runAppendListTest(2, 10000, 500);
	runAppendListTest(2, 100, 10);

	if (deGetNumAvailableLogicalCores() >= 4)
	{
		runAppendListTest(4, 10000, 500);
		runAppendListTest(4, 100, 10);
	}

	// Dtor + clear()
	runClearTest(1, 1, 1);
	runClearTest(1, 2, 10);
	runClearTest(50, 25, 10);
	runClearTest(9, 50, 10);
	runClearTest(10, 50, 10);
	runClearTest(50, 9, 10);
	runClearTest(50, 10, 10);
}